

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::unit_quick_match(string *unit_string,uint64_t match_flags)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  precise_unit pVar4;
  uint64_t in_stack_00000038;
  string *in_stack_00000040;
  precise_unit retunit;
  uint64_t in_stack_00000210;
  string *in_stack_00000218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  __const_iterator in_stack_ffffffffffffffa8;
  double local_40;
  precise_unit *local_38;
  double local_30;
  precise_unit *local_28;
  double local_10;
  precise_unit *local_8;
  
  if ((in_RSI & 0x200) != 0) {
    cleanUnitString(in_stack_00000218,in_stack_00000210);
  }
  pVar4 = get_unit(in_stack_00000040,in_stack_00000038);
  bVar1 = is_valid((precise_unit *)local_68);
  local_28 = pVar4._8_8_;
  if (bVar1) {
    local_30 = pVar4.multiplier_;
    local_10 = local_30;
    local_8 = local_28;
  }
  else {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (in_RDI);
    if ((sVar2 < 3) ||
       (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 back(in_RDI), *pvVar3 != 's')) {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               front(in_RDI);
      if ((*pvVar3 == '[') &&
         (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   back(in_RDI), *pvVar3 == ']')) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                  (in_RDI);
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 back(in_RDI);
        if ((*pvVar3 != 'U') &&
           (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::back(in_RDI), *pvVar3 != 'u')) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                    (in_stack_ffffffffffffff88);
          __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_RDI,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffff88);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                    (local_68,in_stack_ffffffffffffffa8);
          pVar4 = get_unit(in_stack_00000040,in_stack_00000038);
          local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     pVar4.multiplier_;
          local_8 = pVar4._8_8_;
          bVar1 = is_valid(local_8);
          if (bVar1) {
            local_10 = (double)local_68;
            goto LAB_007a16d4;
          }
        }
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (in_RDI);
      pVar4 = get_unit(in_stack_00000040,in_stack_00000038);
      local_40 = pVar4.multiplier_;
      local_38 = pVar4._8_8_;
      bVar1 = is_valid((precise_unit *)local_68);
      if (bVar1) {
        local_10 = local_40;
        local_8 = local_38;
        goto LAB_007a16d4;
      }
    }
    local_10 = NAN;
    local_8 = (precise_unit *)0xfa94a488;
  }
LAB_007a16d4:
  pVar4._8_8_ = local_8;
  pVar4.multiplier_ = local_10;
  return pVar4;
}

Assistant:

static precise_unit
    unit_quick_match(std::string unit_string, std::uint64_t match_flags)
{
    if ((match_flags & case_insensitive) != 0) {  // if not a case insensitive
                                                  // matching process just do a
                                                  // quick scan first
        cleanUnitString(unit_string, match_flags);
    }
    auto retunit = get_unit(unit_string, match_flags);
    if (is_valid(retunit)) {
        return retunit;
    }
    if (unit_string.size() > 2 &&
        unit_string.back() == 's') {  // if the string is of length two this
                                      // is too risky to try since there
                                      // would be many incorrect matches
        unit_string.pop_back();
        retunit = get_unit(unit_string, match_flags);
        if (is_valid(retunit)) {
            return retunit;
        }
    } else if (unit_string.front() == '[' && unit_string.back() == ']') {
        unit_string.pop_back();
        if (unit_string.back() != 'U' && unit_string.back() != 'u') {
            unit_string.erase(unit_string.begin());
            retunit = get_unit(unit_string, match_flags);
            if (is_valid(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}